

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_reparent.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint uVar11;
  ALLEGRO_BITMAP *pAVar12;
  char *format;
  int iVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  ALLEGRO_EVENT event;
  int local_78;
  undefined8 local_70;
  int local_58;
  
  cVar2 = al_install_system(0x5020700,atexit);
  if (cVar2 == '\0') {
    format = "Failed to init Allegro.\n";
  }
  else {
    cVar2 = al_init_image_addon();
    if (cVar2 == '\0') {
      format = "Failed to init IIO addon.\n";
    }
    else {
      al_init_primitives_addon();
      al_set_new_bitmap_flags(0xc0);
      al_set_new_display_flags(0x10);
      example.display = (ALLEGRO_DISPLAY *)al_create_display(800,600);
      if (example.display == (ALLEGRO_DISPLAY *)0x0) {
        format = "Error creating display.\n";
      }
      else {
        cVar2 = al_install_keyboard();
        if (cVar2 == '\0') {
          format = "Error installing keyboard.\n";
        }
        else {
          example.glyphs[0] = (ALLEGRO_BITMAP *)al_load_bitmap("data/font.tga");
          if (example.glyphs[0] == (ALLEGRO_BITMAP *)0x0) {
            format = "Error loading data/font.tga\n";
          }
          else {
            example.glyphs[1] = (ALLEGRO_BITMAP *)al_load_bitmap("data/bmpfont.tga");
            if (example.glyphs[1] != (ALLEGRO_BITMAP *)0x0) {
              example.sub = (ALLEGRO_BITMAP *)al_create_sub_bitmap(example.glyphs[0],0,0,0x20,0x20);
              uVar8 = al_create_timer(0x3f91111111111111);
              uVar9 = al_create_event_queue();
              uVar10 = al_get_keyboard_event_source();
              al_register_event_source(uVar9,uVar10);
              uVar10 = al_get_timer_event_source(uVar8);
              al_register_event_source(uVar9,uVar10);
              uVar10 = al_get_display_event_source(example.display);
              al_register_event_source(uVar9,uVar10);
              al_start_timer(uVar8);
              al_get_display_width(example.display);
              al_get_display_height(example.display);
              do {
                bVar3 = al_is_event_queue_empty(uVar9);
                if (bVar3 != 0) {
                  al_map_rgb_f(0,0,0);
                  al_clear_to_color();
                  iVar13 = 0;
                  al_draw_bitmap(0,0,example.glyphs[0],0);
                  al_draw_bitmap(0,0x43400000,example.glyphs[1],0);
                  iVar6 = example.p;
                  iVar4 = al_get_bitmap_x(example.sub);
                  iVar5 = al_get_bitmap_y(example.sub);
                  iVar7 = iVar5 + 0xc0;
                  if (iVar6 != 1) {
                    iVar7 = iVar5;
                  }
                  iVar6 = al_get_bitmap_width(example.sub);
                  iVar5 = al_get_bitmap_height(example.sub);
                  uVar15 = 0;
                  uVar14 = al_map_rgba_f(0x3f000000,0,0,0x3f000000);
                  al_draw_filled_rectangle
                            ((float)iVar4,(float)iVar7,(float)(iVar6 + iVar4),(float)(iVar5 + iVar7)
                             ,uVar14,uVar15);
                  dVar16 = 0.0;
                  do {
                    al_draw_scaled_rotated_bitmap
                              (0,0,(float)iVar13,0x43b48000,0x40000000,0x40000000,
                               (float)(dVar16 * 0.7853981633974483 * 0.125),example.sub,0);
                    dVar16 = dVar16 + 1.0;
                    iVar13 = iVar13 + 100;
                  } while (iVar13 != 800);
                  al_flip_display();
                }
                bVar3 = bVar3 ^ 1;
                do {
                  al_wait_for_event(uVar9);
                  if (local_78 < 0x29) {
                    if (local_78 == 0xb) {
                      if (local_58 == 0x3b) {
                        return 0;
                      }
                    }
                    else if (local_78 == 0x1e) {
                      iVar7 = example.i + 1;
                      iVar6 = example.i + 4;
                      if (-1 < iVar7) {
                        iVar6 = iVar7;
                      }
                      iVar6 = (iVar6 >> 2) % 0xc4;
                      if (iVar6 < 0x60) {
                        example.p = 0;
                        iVar4 = iVar6 + 0xf;
                        if (-1 < (short)iVar6) {
                          iVar4 = iVar6;
                        }
                        iVar6 = (int)(short)((short)iVar6 - ((ushort)iVar4 & 0xfff0)) << 5;
                        uVar11 = (short)(ushort)iVar4 * 2 & 0xffffffe0;
                        uVar8 = 0x20;
                        uVar10 = 0x20;
                        pAVar12 = example.glyphs[0];
                      }
                      else {
                        example.p = 1;
                        bVar3 = (char)iVar6 + 0xa0;
                        uVar11 = bVar3 / 0x14;
                        iVar6 = (uint)(byte)(bVar3 + (char)uVar11 * -0x14) * 0x25;
                        uVar11 = uVar11 << 5 | uVar11;
                        uVar8 = 0x25;
                        uVar10 = 0x21;
                        pAVar12 = example.glyphs[1];
                      }
                      example.i = iVar7;
                      al_reparent_bitmap(example.sub,pAVar12,iVar6,uVar11,uVar8,uVar10);
                      bVar3 = 1;
                    }
                  }
                  else if (local_78 == 0x29) {
                    al_acknowledge_resize(local_70);
                  }
                  else if (local_78 == 0x2a) {
                    return 0;
                  }
                  al_get_display_width(example.display);
                  al_get_display_height(example.display);
                  bVar1 = bVar3 & 1;
                  bVar3 = 0;
                } while (bVar1 == 0);
              } while( true );
            }
            format = "Error loading data/bmpfont.tga\n";
            example.glyphs[1] = (ALLEGRO_BITMAP *)0x0;
          }
        }
      }
    }
  }
  abort_example(format);
  iVar7 = __cxa_atexit();
  return iVar7;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   int w = 800, h = 600;
   bool done = false;
   bool need_redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Failed to init Allegro.\n");
   }

   if (!al_init_image_addon()) {
      abort_example("Failed to init IIO addon.\n");
   }

   al_init_primitives_addon();

   init_platform_specific();

   al_set_new_bitmap_flags(ALLEGRO_MIN_LINEAR | ALLEGRO_MAG_LINEAR);
   al_set_new_display_flags(ALLEGRO_RESIZABLE);
   example.display = al_create_display(w, h);
   if (!example.display) {
      abort_example("Error creating display.\n");
   }

   if (!al_install_keyboard()) {
      abort_example("Error installing keyboard.\n");
   }

   example.glyphs[0] = al_load_bitmap("data/font.tga");
   if (!example.glyphs[0]) {
      abort_example("Error loading data/font.tga\n");
   }

   example.glyphs[1] = al_load_bitmap("data/bmpfont.tga");
   if (!example.glyphs[1]) {
      abort_example("Error loading data/bmpfont.tga\n");
   }

   init();

   timer = al_create_timer(1.0 / FPS);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());

   al_register_event_source(queue, al_get_timer_event_source(timer));
   
   al_register_event_source(queue, al_get_display_event_source(
      example.display));

   al_start_timer(timer);

   while (!done) {
      ALLEGRO_EVENT event;
      w = al_get_display_width(example.display);
      h = al_get_display_height(example.display);

      if (need_redraw && al_is_event_queue_empty(queue)) {
         redraw();
         al_flip_display();
         need_redraw = false;
      }

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_KEY_CHAR:
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
               done = true;
            break;

         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            done = true;
            break;
         
         case ALLEGRO_EVENT_DISPLAY_RESIZE:
            al_acknowledge_resize(event.display.source);
            break;
              
         case ALLEGRO_EVENT_TIMER:
            update();
            need_redraw = true;
            break;
      }
   }

   return 0;
}